

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void __thiscall CChat::OnStateChange(CChat *this,int NewState,int OldState)

{
  int in_EDX;
  CChat *in_RDI;
  int i;
  int local_14;
  
  if (in_EDX < 2) {
    Disable((CChat *)0x14d1c0);
    for (local_14 = 0; local_14 < 0xfa; local_14 = local_14 + 1) {
      in_RDI->m_aLines[local_14].m_Time = 0;
    }
    in_RDI->m_CurrentLine = 0;
    ClearChatBuffer(in_RDI);
    in_RDI->m_FirstMap = true;
  }
  return;
}

Assistant:

void CChat::OnStateChange(int NewState, int OldState)
{
	if(OldState <= IClient::STATE_CONNECTING)
	{
		Disable();
		for(int i = 0; i < MAX_LINES; i++)
			m_aLines[i].m_Time = 0;
		m_CurrentLine = 0;
		ClearChatBuffer();
		m_FirstMap = true;
	}
}